

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  
  pvVar4 = glfwGetWindowUserPointer(window);
  pcVar5 = glfwGetKeyName(key,scancode);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar4 + 8);
  dVar10 = glfwGetTime();
  pcVar6 = get_key_name(key);
  pcVar7 = get_mods_name(mods);
  if (pcVar5 == (char *)0x0) {
    if ((uint)action < 3) {
      pcVar5 = (&PTR_anon_var_dwarf_8f43_001520e8)[(uint)action];
    }
    else {
      pcVar5 = "caused unknown action";
    }
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",dVar10,
           (ulong)uVar2,(ulong)uVar1,key,(ulong)(uint)scancode,pcVar6,pcVar7,pcVar5);
  }
  else {
    if ((uint)action < 3) {
      pcVar8 = (&PTR_anon_var_dwarf_8f43_001520e8)[(uint)action];
    }
    else {
      pcVar8 = "caused unknown action";
    }
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",dVar10,
           (ulong)uVar2,(ulong)uVar1,key,(ulong)(uint)scancode,pcVar6,pcVar5,pcVar7,pcVar8);
  }
  if (action != 1) {
    return;
  }
  if (key == 0x4c) {
    iVar3 = glfwGetInputMode(window,0x33004);
    bVar9 = iVar3 == 0;
    glfwSetInputMode(window,0x33004,(uint)bVar9);
    pcVar5 = "(( lock key mods %s ))\n";
  }
  else {
    if (key != 0x43) {
      return;
    }
    bVar9 = *(int *)((long)pvVar4 + 0xc) == 0;
    *(uint *)((long)pvVar4 + 0xc) = (uint)bVar9;
    pcVar5 = "(( closing %s ))\n";
  }
  pcVar6 = "disabled";
  if (bVar9) {
    pcVar6 = "enabled";
  }
  printf(pcVar5,pcVar6);
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    const char* name = glfwGetKeyName(key, scancode);

    if (name)
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               name,
               get_mods_name(mods),
               get_action_name(action));
    }
    else
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               get_mods_name(mods),
               get_action_name(action));
    }

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            slot->closeable = !slot->closeable;

            printf("(( closing %s ))\n", slot->closeable ? "enabled" : "disabled");
            break;
        }

        case GLFW_KEY_L:
        {
            const int state = glfwGetInputMode(window, GLFW_LOCK_KEY_MODS);
            glfwSetInputMode(window, GLFW_LOCK_KEY_MODS, !state);

            printf("(( lock key mods %s ))\n", !state ? "enabled" : "disabled");
            break;
        }
    }
}